

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Speed> metaf::Speed::fromString(string *s,Unit unit)

{
  size_t digits;
  bool bVar1;
  optional<unsigned_int> oVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  optional<metaf::Speed> oVar6;
  
  if (s->_M_string_length == 0) {
LAB_001896ef:
    uVar5 = 0x100000000;
  }
  else {
    bVar1 = std::operator==(s,"//");
    if (bVar1) goto LAB_001896ef;
    digits = s->_M_string_length;
    if ((digits == 2) || ((digits == 3 && (*(s->_M_dataplus)._M_p != '0')))) {
      uVar5 = 0;
      oVar2 = strToUint(s,0,digits);
      uVar3 = 0;
      uVar4 = 0;
      if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
        uVar5 = (ulong)unit | 0x100000000;
        uVar3 = (ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffffff;
        uVar4 = 0x100000000;
      }
      goto LAB_001896f6;
    }
    uVar5 = 0;
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_001896f6:
  oVar6.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._M_payload._0_8_ = uVar3 | uVar4;
  oVar6.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Speed>._8_8_ = uVar5;
  return (optional<metaf::Speed>)
         oVar6.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Speed>;
}

Assistant:

std::optional<Speed> Speed::fromString(const std::string & s, Unit unit) {
	//static const std::regex rgx ("([1-9]?\\d\\d)|//");
	static const std::optional<Speed> error;
	if (s.empty() || s == "//") return Speed();
	if (s.length() != 2 && s.length() != 3) return error;
	if (s.length() == 3 && s[0] == '0') return error;
	const auto spd = strToUint(s, 0, s.length());
	if (!spd.has_value()) return error;
	Speed speed;
	speed.speedUnit = unit;
	speed.speedValue = *spd;
	return speed;
}